

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

EVP_CIPHER * padlock_aes_256_ctr(void)

{
  int iVar1;
  undefined8 in_RAX;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  if (_hidden_aes_256_ctr == (EVP_CIPHER *)0x0) {
    _hidden_aes_256_ctr =
         EVP_CIPHER_meth_new(unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
    if (((((_hidden_aes_256_ctr != (EVP_CIPHER *)0x0) &&
          (iVar1 = EVP_CIPHER_meth_set_iv_length(_hidden_aes_256_ctr,0x10), iVar1 != 0)) &&
         (iVar1 = EVP_CIPHER_meth_set_flags(_hidden_aes_256_ctr,5), iVar1 != 0)) &&
        ((iVar1 = EVP_CIPHER_meth_set_init(_hidden_aes_256_ctr,padlock_aes_init_key), iVar1 != 0 &&
         (iVar1 = EVP_CIPHER_meth_set_do_cipher(_hidden_aes_256_ctr,padlock_ctr_cipher), iVar1 != 0)
         ))) && ((iVar1 = EVP_CIPHER_meth_set_impl_ctx_size(_hidden_aes_256_ctr,0x124), iVar1 != 0
                 && ((iVar1 = EVP_CIPHER_meth_set_set_asn1_params
                                        (_hidden_aes_256_ctr,EVP_CIPHER_set_asn1_iv), iVar1 != 0 &&
                     (iVar1 = EVP_CIPHER_meth_set_get_asn1_params
                                        (_hidden_aes_256_ctr,EVP_CIPHER_get_asn1_iv), iVar1 != 0))))
                )) {
      return _hidden_aes_256_ctr;
    }
    EVP_CIPHER_meth_free((EVP_CIPHER *)0x2e5e66);
    _hidden_aes_256_ctr = (EVP_CIPHER *)0x0;
  }
  return _hidden_aes_256_ctr;
}

Assistant:

static int
padlock_ciphers(ENGINE *e, const EVP_CIPHER **cipher, const int **nids,
                int nid)
{
    /* No specific cipher => return a list of supported nids ... */
    if (!cipher) {
        *nids = padlock_cipher_nids;
        return padlock_cipher_nids_num;
    }

    /* ... or the requested "cipher" otherwise */
    switch (nid) {
    case NID_aes_128_ecb:
        *cipher = padlock_aes_128_ecb();
        break;
    case NID_aes_128_cbc:
        *cipher = padlock_aes_128_cbc();
        break;
    case NID_aes_128_cfb:
        *cipher = padlock_aes_128_cfb();
        break;
    case NID_aes_128_ofb:
        *cipher = padlock_aes_128_ofb();
        break;
    case NID_aes_128_ctr:
        *cipher = padlock_aes_128_ctr();
        break;

    case NID_aes_192_ecb:
        *cipher = padlock_aes_192_ecb();
        break;
    case NID_aes_192_cbc:
        *cipher = padlock_aes_192_cbc();
        break;
    case NID_aes_192_cfb:
        *cipher = padlock_aes_192_cfb();
        break;
    case NID_aes_192_ofb:
        *cipher = padlock_aes_192_ofb();
        break;
    case NID_aes_192_ctr:
        *cipher = padlock_aes_192_ctr();
        break;

    case NID_aes_256_ecb:
        *cipher = padlock_aes_256_ecb();
        break;
    case NID_aes_256_cbc:
        *cipher = padlock_aes_256_cbc();
        break;
    case NID_aes_256_cfb:
        *cipher = padlock_aes_256_cfb();
        break;
    case NID_aes_256_ofb:
        *cipher = padlock_aes_256_ofb();
        break;
    case NID_aes_256_ctr:
        *cipher = padlock_aes_256_ctr();
        break;

    default:
        /* Sorry, we don't support this NID */
        *cipher = NULL;
        return 0;
    }

    return 1;
}